

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeExprList(Parse *pParse,ExprList *pList,int target,int srcReg,u8 flags)

{
  ushort uVar1;
  int iVar2;
  Vdbe *p;
  Expr *p_00;
  Op *pOVar3;
  int iVar4;
  int iVar5;
  int target_00;
  byte bVar6;
  int iVar7;
  ExprList_item *pEVar8;
  
  iVar5 = pList->nExpr;
  if (0 < iVar5) {
    p = pParse->pVdbe;
    bVar6 = flags & 0x7d;
    if (pParse->okConstFactor != '\0') {
      bVar6 = flags;
    }
    pEVar8 = pList->a;
    iVar7 = 0;
    do {
      p_00 = pEVar8->pExpr;
      if (((bVar6 & 4) == 0) || (uVar1 = (pEVar8->u).x.iOrderByCol, uVar1 == 0)) {
        if (((bVar6 & 2) == 0) || (iVar4 = sqlite3ExprIsConstant(p_00), iVar4 == 0)) {
          target_00 = iVar7 + target;
          iVar4 = sqlite3ExprCodeTarget(pParse,p_00,target_00);
          if (iVar4 != target_00) {
            if ((flags & 1) != 0) {
              pOVar3 = (Op *)&sqlite3VdbeGetOp_dummy;
              if (p->db->mallocFailed == '\0') {
                pOVar3 = p->aOp + (long)p->nOp + -1;
              }
              if (((pOVar3->opcode == 'T') && (iVar2 = pOVar3->p3, pOVar3->p1 + iVar2 + 1 == iVar4))
                 && (pOVar3->p2 + iVar2 + 1 == target_00)) {
                pOVar3->p3 = iVar2 + 1;
                goto LAB_001557ac;
              }
            }
LAB_0015579d:
            sqlite3VdbeAddOp3(p,(uint)(flags & 1 ^ 0x55),iVar4,iVar7 + target,0);
          }
        }
        else {
          sqlite3ExprCodeAtInit(pParse,p_00,iVar7 + target);
        }
      }
      else {
        if ((bVar6 & 8) == 0) {
          iVar4 = (uint)uVar1 + srcReg + -1;
          goto LAB_0015579d;
        }
        iVar7 = iVar7 + -1;
        iVar5 = iVar5 + -1;
      }
LAB_001557ac:
      iVar7 = iVar7 + 1;
      pEVar8 = pEVar8 + 1;
    } while (iVar7 < iVar5);
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeExprList(
  Parse *pParse,     /* Parsing context */
  ExprList *pList,   /* The expression list to be coded */
  int target,        /* Where to write results */
  int srcReg,        /* Source registers if SQLITE_ECEL_REF */
  u8 flags           /* SQLITE_ECEL_* flags */
){
  struct ExprList_item *pItem;
  int i, j, n;
  u8 copyOp = (flags & SQLITE_ECEL_DUP) ? OP_Copy : OP_SCopy;
  Vdbe *v = pParse->pVdbe;
  assert( pList!=0 );
  assert( target>0 );
  assert( pParse->pVdbe!=0 );  /* Never gets this far otherwise */
  n = pList->nExpr;
  if( !ConstFactorOk(pParse) ) flags &= ~SQLITE_ECEL_FACTOR;
  for(pItem=pList->a, i=0; i<n; i++, pItem++){
    Expr *pExpr = pItem->pExpr;
    if( (flags & SQLITE_ECEL_REF)!=0 && (j = pItem->u.x.iOrderByCol)>0 ){
      if( flags & SQLITE_ECEL_OMITREF ){
        i--;
        n--;
      }else{
        sqlite3VdbeAddOp2(v, copyOp, j+srcReg-1, target+i);
      }
    }else if( (flags & SQLITE_ECEL_FACTOR)!=0 && sqlite3ExprIsConstant(pExpr) ){
      sqlite3ExprCodeAtInit(pParse, pExpr, target+i);
    }else{
      int inReg = sqlite3ExprCodeTarget(pParse, pExpr, target+i);
      if( inReg!=target+i ){
        VdbeOp *pOp;
        if( copyOp==OP_Copy
         && (pOp=sqlite3VdbeGetOp(v, -1))->opcode==OP_Copy
         && pOp->p1+pOp->p3+1==inReg
         && pOp->p2+pOp->p3+1==target+i
        ){
          pOp->p3++;
        }else{
          sqlite3VdbeAddOp2(v, copyOp, inReg, target+i);
        }
      }
    }
  }
  return n;
}